

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O0

QMatrix * Mul_SQ(double S,QMatrix *Q)

{
  LASErrIdType LVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *QResName;
  QMatrix *QRes;
  QMatrix *Q_local;
  double S_local;
  
  Q_Lock(Q);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    QResName = (char *)malloc(0xb0);
    pcVar2 = Q_GetName(Q);
    sVar3 = strlen(pcVar2);
    pcVar2 = (char *)malloc(sVar3 + 0x14);
    if (((QMatrix *)QResName == (QMatrix *)0x0) || (pcVar2 == (char *)0x0)) {
      pcVar4 = Q_GetName(Q);
      LASError(LASMemAllocErr,"Mul_SQ",pcVar4,(char *)0x0,(char *)0x0);
      if ((QMatrix *)QResName != (QMatrix *)0x0) {
        free(QResName);
      }
    }
    else {
      pcVar4 = Q_GetName(Q);
      sprintf(pcVar2,"%12.5e * (%s)",S,pcVar4);
      Q_Constr((QMatrix *)QResName,pcVar2,Q->Dim,Q->Symmetry,Q->ElOrder,Tempor,False);
      LVar1 = LASResult();
      if (LVar1 == LASOK) {
        if ((Q->Instance == Tempor) && (Q->OwnData != False)) {
          Q->OwnData = False;
          ((QMatrix *)QResName)->OwnData = True;
        }
        ((QMatrix *)QResName)->MultiplD = S * Q->MultiplD;
        ((QMatrix *)QResName)->MultiplU = S * Q->MultiplU;
        ((QMatrix *)QResName)->MultiplL = S * Q->MultiplL;
        ((QMatrix *)QResName)->Len = Q->Len;
        ((QMatrix *)QResName)->El = Q->El;
        ((QMatrix *)QResName)->ElSorted = Q->ElSorted;
        ((QMatrix *)QResName)->DiagElAlloc = Q->DiagElAlloc;
        ((QMatrix *)QResName)->DiagEl = Q->DiagEl;
        ((QMatrix *)QResName)->ZeroInDiag = Q->ZeroInDiag;
        ((QMatrix *)QResName)->InvDiagEl = Q->InvDiagEl;
        ((QMatrix *)QResName)->UnitRightKer = Q->UnitRightKer;
        ((QMatrix *)QResName)->RightKerCmp = Q->RightKerCmp;
        ((QMatrix *)QResName)->UnitLeftKer = Q->UnitLeftKer;
        ((QMatrix *)QResName)->LeftKerCmp = Q->LeftKerCmp;
        ((QMatrix *)QResName)->ILUExists = Q->ILUExists;
        ((QMatrix *)QResName)->ILU = Q->ILU;
      }
    }
    if (pcVar2 != (char *)0x0) {
      free(pcVar2);
    }
  }
  else {
    QResName = (char *)0x0;
  }
  Q_Unlock(Q);
  return (QMatrix *)QResName;
}

Assistant:

QMatrix *Mul_SQ(double S, QMatrix *Q)
/* QRes = S * Q */
{
    QMatrix *QRes;
    
    char *QResName;

    Q_Lock(Q);
    
    if (LASResult() == LASOK) {
        QRes = (QMatrix *)malloc(sizeof(QMatrix));
        QResName = (char *)malloc((strlen(Q_GetName(Q)) + 20) * sizeof(char));
        if (QRes != NULL && QResName != NULL) {
            sprintf(QResName, "%12.5e * (%s)", S, Q_GetName(Q));
            Q_Constr(QRes, QResName, Q->Dim, Q->Symmetry, Q->ElOrder, Tempor, False);
            if (LASResult() == LASOK) {
                if (Q->Instance == Tempor && Q->OwnData) {
                    Q->OwnData = False;
                    QRes->OwnData = True;
                }
                QRes->MultiplD = S * Q->MultiplD;
                QRes->MultiplU = S * Q->MultiplU;
                QRes->MultiplL = S * Q->MultiplL;
                QRes->Len = Q->Len;
                QRes->El = Q->El;
                QRes->ElSorted = Q->ElSorted;
                QRes->DiagElAlloc = Q->DiagElAlloc;
                QRes->DiagEl = Q->DiagEl;
                QRes->ZeroInDiag = Q->ZeroInDiag;
                QRes->InvDiagEl = Q->InvDiagEl;
                QRes->UnitRightKer = Q->UnitRightKer;
                QRes->RightKerCmp = Q->RightKerCmp;
                QRes->UnitLeftKer = Q->UnitLeftKer;
                QRes->LeftKerCmp = Q->LeftKerCmp;
                QRes->ILUExists = Q->ILUExists;
                QRes->ILU = Q->ILU;
            }
        } else {
            LASError(LASMemAllocErr, "Mul_SQ", Q_GetName(Q), NULL, NULL);
            if (QRes != NULL)
                free(QRes);
        }
            
        if (QResName != NULL)
            free(QResName);
    } else {
        QRes = NULL;
    }

    Q_Unlock(Q);

    return(QRes);
}